

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

size_t btokBAuthT_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  sVar1 = btokBAuthTStart_deep(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  sVar2 = btokBAuthTStep3_deep(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  sVar3 = btokBAuthTStep5_deep(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return sVar1;
}

Assistant:

static size_t btokBAuthT_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(3,
		btokBAuthTStart_deep(n, f_deep, ec_d, ec_deep),
		btokBAuthTStep3_deep(n, f_deep, ec_d, ec_deep),
		btokBAuthTStep5_deep(n, f_deep, ec_d, ec_deep));
}